

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::Boxed_Number::const_binary_go<signed_char>
          (Boxed_Number *this,Opers t_oper,char *t,char *u)

{
  bad_any_cast *this_00;
  arithmetic_error *this_01;
  Boxed_Value BVar1;
  string local_40;
  
  switch(t_oper) {
  case sum:
    local_40._M_dataplus._M_p._0_4_ = (int)*u + (int)*t;
    break;
  case quotient:
    if (*u == 0) {
      this_01 = (arithmetic_error *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      local_40.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
      local_40.field_2._M_allocated_capacity._6_2_ = 0x6220;
      local_40.field_2._8_6_ = 0x6f72657a2079;
      local_40._M_string_length = 0xe;
      local_40.field_2._M_local_buf[0xe] = '\0';
      exception::arithmetic_error::arithmetic_error(this_01,&local_40);
      __cxa_throw(this_01,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error)
      ;
    }
    local_40._M_dataplus._M_p._0_4_ = (int)*t / (int)*u;
    break;
  case product:
    local_40._M_dataplus._M_p._0_4_ = (int)*u * (int)*t;
    break;
  case difference:
    local_40._M_dataplus._M_p._0_4_ = (int)*t - (int)*u;
    break;
  default:
    this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
    detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  }
  BVar1 = detail::const_var_impl<int>((detail *)this,(int *)&local_40);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value const_binary_go(Operators::Opers t_oper, const T &t, const T &u) 
      {
        switch (t_oper)
        {
          case Operators::sum:
            return const_var(t + u);
          case Operators::quotient:
            check_divide_by_zero(u);
            return const_var(t / u);
          case Operators::product:
            return const_var(t * u);
          case Operators::difference:
            return const_var(t - u);
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }
      }